

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

int __thiscall Fossilize::Instance::init(Instance *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  LogLevel LVar7;
  uint uVar8;
  char *pcVar9;
  ApplicationInfoFilter *pAVar10;
  VkApplicationInfo *pVVar11;
  size_t sVar12;
  char *pcVar13;
  VkLayerInstanceDispatchTable *in_RCX;
  undefined8 *in_RDX;
  EVP_PKEY_CTX *ctx_00;
  PFN_vkGetInstanceProcAddr in_R8;
  size_t sVar14;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)globalInfoFilterLock);
  if (iVar6 == 0) {
    if (globalInfoFilterDone == '\0') {
      pcVar9 = getenv("FOSSILIZE_APPLICATION_INFO_FILTER_PATH");
      if (pcVar9 != (char *)0x0) {
        pAVar10 = ApplicationInfoFilter::parse
                            (pcVar9,getApplicationInfoFilter::anon_class_1_0_00000001::__invoke,
                             (void *)0x0);
        std::
        __uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
        ::reset((__uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                 *)&globalInfoFilter,pAVar10);
        if (globalInfoFilter == (ApplicationInfoFilter *)0x0) {
          LVar7 = get_thread_log_level();
          if ((int)LVar7 < 3) {
            ctx_00 = (EVP_PKEY_CTX *)0x2;
            bVar5 = Internal::log_thread_callback
                              (LOG_ERROR,
                               "Failed to parse ApplicationInfoFilter, letting recording go through.\n"
                              );
            if (!bVar5) {
              init(ctx_00);
            }
          }
        }
      }
      globalInfoFilterDone = '\x01';
    }
    pAVar10 = globalInfoFilter;
    uVar8 = pthread_mutex_unlock((pthread_mutex_t *)globalInfoFilterLock);
    pVVar11 = (VkApplicationInfo *)(ulong)uVar8;
    this->infoFilter = pAVar10;
    this->instance = (VkInstance)ctx;
    this->pTable = in_RCX;
    this->gpa = in_R8;
    if ((in_RDX != (undefined8 *)0x0) && (in_RDX[1] == 0)) {
      pVVar11 = (VkApplicationInfo *)ScratchAllocator::allocate_raw(&this->alloc,0x30,0x10);
      this->pAppInfo = pVVar11;
      uVar1 = *in_RDX;
      pvVar2 = (void *)in_RDX[1];
      pcVar9 = (char *)in_RDX[2];
      uVar3 = in_RDX[3];
      uVar4 = in_RDX[5];
      pVVar11->pEngineName = (char *)in_RDX[4];
      pVVar11->engineVersion = (int)uVar4;
      pVVar11->apiVersion = (int)((ulong)uVar4 >> 0x20);
      pVVar11->pApplicationName = pcVar9;
      *(undefined8 *)&pVVar11->applicationVersion = uVar3;
      *(undefined8 *)pVVar11 = uVar1;
      pVVar11->pNext = pvVar2;
      pcVar9 = (char *)in_RDX[2];
      if (pcVar9 != (char *)0x0) {
        sVar12 = strlen(pcVar9);
        sVar14 = sVar12 + 1;
        if (sVar14 == 0) {
          pcVar13 = (char *)0x0;
        }
        else {
          pcVar13 = (char *)ScratchAllocator::allocate_raw(&this->alloc,sVar14,0x10);
          pcVar9 = (char *)in_RDX[2];
        }
        memcpy(pcVar13,pcVar9,sVar14);
        pVVar11 = this->pAppInfo;
        pVVar11->pApplicationName = pcVar13;
      }
      pcVar9 = (char *)in_RDX[4];
      if (pcVar9 != (char *)0x0) {
        sVar12 = strlen(pcVar9);
        sVar14 = sVar12 + 1;
        if (sVar14 == 0) {
          pcVar13 = (char *)0x0;
        }
        else {
          pcVar13 = (char *)ScratchAllocator::allocate_raw(&this->alloc,sVar14,0x10);
          pcVar9 = (char *)in_RDX[4];
        }
        memcpy(pcVar13,pcVar9,sVar14);
        pVVar11 = this->pAppInfo;
        pVVar11->pEngineName = pcVar13;
      }
    }
    return (int)pVVar11;
  }
  std::__throw_system_error(iVar6);
}

Assistant:

void Instance::init(VkInstance instance_, const VkApplicationInfo *pApp, VkLayerInstanceDispatchTable *pTable_, PFN_vkGetInstanceProcAddr gpa_)
{
	infoFilter = getApplicationInfoFilter();
	instance = instance_;
	pTable = pTable_;
	gpa = gpa_;

	// pNext in appInfo is not supported.
	if (pApp && !pApp->pNext)
	{
		pAppInfo = alloc.allocate<VkApplicationInfo>();
		*pAppInfo = *pApp;

		if (pApp->pApplicationName)
		{
			size_t len = strlen(pApp->pApplicationName) + 1;
			char *pAppName = alloc.allocate_n<char>(len);
			memcpy(pAppName, pApp->pApplicationName, len);
			pAppInfo->pApplicationName = pAppName;
		}

		if (pApp->pEngineName)
		{
			size_t len = strlen(pApp->pEngineName) + 1;
			char *pEngineName = alloc.allocate_n<char>(len);
			memcpy(pEngineName, pApp->pEngineName, len);
			pAppInfo->pEngineName = pEngineName;
		}
	}
}